

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

string * __thiscall
mocker::ir::fmtInst_abi_cxx11_
          (string *__return_storage_ptr__,ir *this,shared_ptr<mocker::ir::IRInst> *inst)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  OpType OVar3;
  int iVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  element_type *this_00;
  shared_ptr<mocker::ir::Label> *psVar12;
  element_type *peVar13;
  element_type *peVar14;
  element_type *this_01;
  element_type *this_02;
  element_type *peVar15;
  __shared_ptr *p_Var16;
  string *psVar17;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *this_03;
  element_type *peVar18;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *this_04;
  element_type *peVar19;
  shared_ptr<mocker::ir::Reg> *psVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  ir *piVar22;
  shared_ptr<mocker::ir::Addr> *addr_00;
  shared_ptr<mocker::ir::Addr> *addr_01;
  shared_ptr<mocker::ir::Addr> *addr_02;
  shared_ptr<mocker::ir::Addr> *addr_03;
  shared_ptr<mocker::ir::Addr> *addr_04;
  shared_ptr<mocker::ir::Addr> *addr_05;
  shared_ptr<mocker::ir::Addr> *addr_06;
  shared_ptr<mocker::ir::Addr> *addr_07;
  shared_ptr<mocker::ir::Addr> *addr_08;
  shared_ptr<mocker::ir::Addr> *addr_09;
  shared_ptr<mocker::ir::Addr> *addr_10;
  shared_ptr<mocker::ir::Addr> *addr_11;
  shared_ptr<mocker::ir::Addr> *addr_12;
  shared_ptr<mocker::ir::Addr> *addr_13;
  shared_ptr<mocker::ir::Addr> *addr_14;
  shared_ptr<mocker::ir::Addr> *addr_15;
  shared_ptr<mocker::ir::Addr> *addr_16;
  shared_ptr<mocker::ir::Addr> *addr_17;
  shared_ptr<mocker::ir::Addr> *addr_18;
  shared_ptr<mocker::ir::Addr> *addr_19;
  shared_ptr<mocker::ir::Addr> *addr_20;
  shared_ptr<mocker::ir::Addr> *addr_21;
  shared_ptr<mocker::ir::Addr> *addr_22;
  shared_ptr<mocker::ir::Addr> *addr_23;
  shared_ptr<mocker::ir::Addr> *addr_24;
  shared_ptr<mocker::ir::Addr> *addr_25;
  shared_ptr<mocker::ir::Addr> *addr_26;
  char *pcVar23;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10a0;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_fb0;
  string local_e70;
  string local_e50;
  OpType local_e2c;
  shared_ptr<mocker::ir::Addr> local_e28;
  string local_e18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d78;
  undefined1 local_d51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  OpType local_d2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  OpType local_d04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d00;
  OpType local_cdc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  OpType local_cb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  OpType local_c8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  OpType local_c64;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c60;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c58;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c30;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c08;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_be0;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bb8;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b90;
  undefined1 local_b68 [16];
  undefined1 local_b58 [8];
  shared_ptr<mocker::ir::RelationInst> p_14;
  string local_b38;
  string local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  reference local_a78;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *kv;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *__range3_1;
  string local_a48;
  undefined1 local_a21;
  undefined1 local_a20 [8];
  shared_ptr<mocker::ir::Phi> p_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  ir *local_9d0;
  shared_ptr<mocker::ir::Addr> *addr;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *__range3;
  shared_ptr<mocker::ir::Addr> local_990;
  string local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  undefined1 local_939;
  undefined1 local_938 [8];
  shared_ptr<mocker::ir::Call> p_12;
  shared_ptr<mocker::ir::AttachedComment> p_11;
  shared_ptr<mocker::ir::Comment> p_10;
  string local_8e8;
  OpType local_8c4;
  shared_ptr<mocker::ir::Addr> local_8c0;
  string local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  undefined1 local_7e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  OpType local_7c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  OpType local_79c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  OpType local_774;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  OpType local_74c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  OpType local_724;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  OpType local_6fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  OpType local_6d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  OpType local_6ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  OpType local_684;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  OpType local_65c;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_658;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_650;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_628;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_600;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d8;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5b0;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_588;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_560;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_510;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [8];
  shared_ptr<mocker::ir::ArithBinaryInst> p_9;
  undefined1 local_480 [8];
  shared_ptr<mocker::ir::Ret> p_8;
  string local_460;
  undefined1 local_440 [8];
  shared_ptr<mocker::ir::Jump> p_7;
  string local_420;
  shared_ptr<mocker::ir::Addr> local_400;
  string local_3f0;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  undefined1 local_330 [8];
  shared_ptr<mocker::ir::Branch> p_6;
  shared_ptr<mocker::ir::Addr> local_300;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  shared_ptr<mocker::ir::Load> p_5;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  shared_ptr<mocker::ir::Store> p_4;
  shared_ptr<mocker::ir::Addr> local_1f0;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [8];
  shared_ptr<mocker::ir::Malloc> p_3;
  string local_180;
  undefined1 local_160 [8];
  shared_ptr<mocker::ir::Alloca> p_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  shared_ptr<mocker::ir::Addr> local_110;
  string local_100;
  undefined1 local_d9;
  undefined1 local_d8 [8];
  shared_ptr<mocker::ir::ArithUnaryInst> p_1;
  string local_c0;
  shared_ptr<mocker::ir::Addr> local_a0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  shared_ptr<mocker::ir::Assign> p;
  allocator<char> local_29;
  shared_ptr<mocker::ir::Deleted> local_28;
  ir *local_18;
  shared_ptr<mocker::ir::IRInst> *inst_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *res;
  
  local_18 = this;
  inst_local = (shared_ptr<mocker::ir::IRInst> *)__return_storage_ptr__;
  dyc<mocker::ir::Deleted,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&local_28,(shared_ptr<mocker::ir::IRInst> *)this);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28);
  std::shared_ptr<mocker::ir::Deleted>::~shared_ptr(&local_28);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>const&>
              ((ir *)local_50,(shared_ptr<mocker::ir::IRInst> *)local_18);
    p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._4_1_ = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
    if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_1_) {
      peVar5 = std::
               __shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
      psVar20 = Definition::getDest(&peVar5->super_Definition);
      std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_a0,psVar20);
      fmtAddr_abi_cxx11_(&local_90,(ir *)&local_a0,addr_00);
      std::operator+(&local_70,&local_90," = assign ");
      peVar5 = std::
               __shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
      piVar22 = (ir *)Assign::getOperand(peVar5);
      fmtAddr_abi_cxx11_(&local_c0,piVar22,addr_01);
      std::operator+(__return_storage_ptr__,&local_70,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_a0);
    }
    p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._5_3_ = 0;
    std::shared_ptr<mocker::ir::Assign>::~shared_ptr((shared_ptr<mocker::ir::Assign> *)local_50);
    if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ == 0) {
      dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)local_d8,(shared_ptr<mocker::ir::IRInst> *)local_18);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d8);
      if (bVar2) {
        local_d9 = 0;
        peVar6 = std::
                 __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_d8);
        psVar20 = Definition::getDest(&peVar6->super_Definition);
        std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_110,psVar20);
        fmtAddr_abi_cxx11_(&local_100,(ir *)&local_110,addr_02);
        std::operator+(__return_storage_ptr__,&local_100," = ");
        std::__cxx11::string::~string((string *)&local_100);
        std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_110);
        peVar6 = std::
                 __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_d8);
        OVar3 = ArithUnaryInst::getOp(peVar6);
        pcVar23 = "bitnot";
        if (OVar3 == Neg) {
          pcVar23 = "neg";
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar23);
        peVar6 = std::
                 __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_d8);
        piVar22 = (ir *)ArithUnaryInst::getOperand(peVar6);
        fmtAddr_abi_cxx11_((string *)
                           &p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,piVar22,addr_03);
        std::operator+(&local_130," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string
                  ((string *)
                   &p_2.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 1;
        local_d9 = 1;
      }
      else {
        p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 0;
      }
      std::shared_ptr<mocker::ir::ArithUnaryInst>::~shared_ptr
                ((shared_ptr<mocker::ir::ArithUnaryInst> *)local_d8);
      if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_4_ == 0) {
        dyc<mocker::ir::Alloca,std::shared_ptr<mocker::ir::IRInst>const&>
                  ((ir *)local_160,(shared_ptr<mocker::ir::IRInst> *)local_18);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_160);
        if (bVar2) {
          peVar7 = std::
                   __shared_ptr_access<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_160);
          psVar20 = Definition::getDest(&peVar7->super_Definition);
          p_Var1 = &p_3.super___shared_ptr<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                    ((shared_ptr<mocker::ir::Addr> *)p_Var1,psVar20);
          fmtAddr_abi_cxx11_(&local_180,(ir *)p_Var1,addr_04);
          std::operator+(__return_storage_ptr__,&local_180," = alloca");
          std::__cxx11::string::~string((string *)&local_180);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                    ((shared_ptr<mocker::ir::Addr> *)
                     &p_3.super___shared_ptr<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._5_3_ = 0;
        p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_1_ = bVar2;
        std::shared_ptr<mocker::ir::Alloca>::~shared_ptr
                  ((shared_ptr<mocker::ir::Alloca> *)local_160);
        if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ == 0) {
          dyc<mocker::ir::Malloc,std::shared_ptr<mocker::ir::IRInst>const&>
                    ((ir *)local_1a0,(shared_ptr<mocker::ir::IRInst> *)local_18);
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1a0);
          if (bVar2) {
            peVar8 = std::
                     __shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_1a0);
            psVar20 = Definition::getDest(&peVar8->super_Definition);
            std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_1f0,psVar20);
            fmtAddr_abi_cxx11_(&local_1e0,(ir *)&local_1f0,addr_05);
            std::operator+(&local_1c0,&local_1e0," = malloc ");
            peVar8 = std::
                     __shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_1a0);
            piVar22 = (ir *)Malloc::getSize(peVar8);
            fmtAddr_abi_cxx11_((string *)
                               &p_4.
                                super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,piVar22,addr_06);
            std::operator+(__return_storage_ptr__,&local_1c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
            std::__cxx11::string::~string
                      ((string *)
                       &p_4.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_1f0);
          }
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._5_3_ = 0;
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_1_ = bVar2;
          std::shared_ptr<mocker::ir::Malloc>::~shared_ptr
                    ((shared_ptr<mocker::ir::Malloc> *)local_1a0);
          if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ == 0) {
            dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>const&>
                      ((ir *)local_220,(shared_ptr<mocker::ir::IRInst> *)local_18);
            bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_220);
            if (bVar2) {
              peVar9 = std::
                       __shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_220);
              piVar22 = (ir *)Store::getAddr(peVar9);
              fmtAddr_abi_cxx11_(&local_280,piVar22,addr_07);
              std::operator+(&local_260,"store ",&local_280);
              std::operator+(&local_240,&local_260," ");
              peVar9 = std::
                       __shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_220);
              piVar22 = (ir *)Store::getVal(peVar9);
              fmtAddr_abi_cxx11_((string *)
                                 &p_5.
                                  super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,piVar22,addr_08);
              std::operator+(__return_storage_ptr__,&local_240,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &p_5.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
              std::__cxx11::string::~string
                        ((string *)
                         &p_5.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::__cxx11::string::~string((string *)&local_240);
              std::__cxx11::string::~string((string *)&local_260);
              std::__cxx11::string::~string((string *)&local_280);
            }
            p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._5_3_ = 0;
            p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_1_ = bVar2;
            std::shared_ptr<mocker::ir::Store>::~shared_ptr
                      ((shared_ptr<mocker::ir::Store> *)local_220);
            if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._4_4_ == 0) {
              dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>const&>
                        ((ir *)local_2b0,(shared_ptr<mocker::ir::IRInst> *)local_18);
              bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2b0);
              if (bVar2) {
                peVar10 = std::
                          __shared_ptr_access<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_2b0);
                psVar20 = Definition::getDest(&peVar10->super_Definition);
                std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                          (&local_300,psVar20);
                fmtAddr_abi_cxx11_(&local_2f0,(ir *)&local_300,addr_09);
                std::operator+(&local_2d0,&local_2f0," = load ");
                peVar10 = std::
                          __shared_ptr_access<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_2b0);
                piVar22 = (ir *)Load::getAddr(peVar10);
                fmtAddr_abi_cxx11_((string *)
                                   &p_6.
                                    super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,piVar22,addr_10);
                std::operator+(__return_storage_ptr__,&local_2d0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p_6.
                                super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                std::__cxx11::string::~string
                          ((string *)
                           &p_6.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__cxx11::string::~string((string *)&local_2d0);
                std::__cxx11::string::~string((string *)&local_2f0);
                std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_300);
              }
              p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._5_3_ = 0;
              p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_1_ = bVar2;
              std::shared_ptr<mocker::ir::Load>::~shared_ptr
                        ((shared_ptr<mocker::ir::Load> *)local_2b0);
              if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_4_ == 0) {
                dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>
                          ((ir *)local_330,(shared_ptr<mocker::ir::IRInst> *)local_18);
                bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_330);
                if (bVar2) {
                  peVar11 = std::
                            __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_330);
                  piVar22 = (ir *)Branch::getCondition(peVar11);
                  fmtAddr_abi_cxx11_(&local_3d0,piVar22,addr_11);
                  std::operator+(&local_3b0,"br ",&local_3d0);
                  std::operator+(&local_390,&local_3b0," ");
                  peVar11 = std::
                            __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_330);
                  psVar12 = Branch::getThen(peVar11);
                  std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Label,void>
                            (&local_400,psVar12);
                  fmtAddr_abi_cxx11_(&local_3f0,(ir *)&local_400,addr_12);
                  std::operator+(&local_370,&local_390,&local_3f0);
                  std::operator+(&local_350,&local_370," ");
                  peVar11 = std::
                            __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_330);
                  psVar12 = Branch::getElse(peVar11);
                  p_Var1 = &p_7.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount;
                  std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Label,void>
                            ((shared_ptr<mocker::ir::Addr> *)p_Var1,psVar12);
                  fmtAddr_abi_cxx11_(&local_420,(ir *)p_Var1,addr_13);
                  std::operator+(__return_storage_ptr__,&local_350,&local_420);
                  std::__cxx11::string::~string((string *)&local_420);
                  std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                            ((shared_ptr<mocker::ir::Addr> *)
                             &p_7.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  std::__cxx11::string::~string((string *)&local_350);
                  std::__cxx11::string::~string((string *)&local_370);
                  std::__cxx11::string::~string((string *)&local_3f0);
                  std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_400);
                  std::__cxx11::string::~string((string *)&local_390);
                  std::__cxx11::string::~string((string *)&local_3b0);
                  std::__cxx11::string::~string((string *)&local_3d0);
                }
                p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._5_3_ = 0;
                p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._4_1_ = bVar2;
                std::shared_ptr<mocker::ir::Branch>::~shared_ptr
                          ((shared_ptr<mocker::ir::Branch> *)local_330);
                if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_ == 0) {
                  dyc<mocker::ir::Jump,std::shared_ptr<mocker::ir::IRInst>const&>
                            ((ir *)local_440,(shared_ptr<mocker::ir::IRInst> *)local_18);
                  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_440);
                  if (bVar2) {
                    this_00 = std::
                              __shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_440);
                    psVar12 = Jump::getLabel(this_00);
                    p_Var1 = &p_8.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount;
                    std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Label,void>
                              ((shared_ptr<mocker::ir::Addr> *)p_Var1,psVar12);
                    fmtAddr_abi_cxx11_(&local_460,(ir *)p_Var1,addr_14);
                    std::operator+(__return_storage_ptr__,"jump ",&local_460);
                    std::__cxx11::string::~string((string *)&local_460);
                    std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                              ((shared_ptr<mocker::ir::Addr> *)
                               &p_8.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                  }
                  p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._5_3_ = 0;
                  p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_1_ = bVar2;
                  std::shared_ptr<mocker::ir::Jump>::~shared_ptr
                            ((shared_ptr<mocker::ir::Jump> *)local_440);
                  if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._4_4_ == 0) {
                    dyc<mocker::ir::Ret,std::shared_ptr<mocker::ir::IRInst>const&>
                              ((ir *)local_480,(shared_ptr<mocker::ir::IRInst> *)local_18);
                    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_480);
                    if (bVar2) {
                      peVar13 = std::
                                __shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_480);
                      p_Var16 = (__shared_ptr *)Ret::getVal(peVar13);
                      bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var16);
                      if (bVar2) {
                        peVar13 = std::
                                  __shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)local_480);
                        piVar22 = (ir *)Ret::getVal(peVar13);
                        fmtAddr_abi_cxx11_((string *)
                                           &p_9.
                                            super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,piVar22,addr_15);
                      }
                      else {
                        s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&p_9.
                                         super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount,"void",4);
                      }
                      std::operator+(__return_storage_ptr__,"ret ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&p_9.
                                         super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
                      std::__cxx11::string::~string
                                ((string *)
                                 &p_9.
                                  super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._4_4_ = 1;
                    }
                    else {
                      p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._4_4_ = 0;
                    }
                    std::shared_ptr<mocker::ir::Ret>::~shared_ptr
                              ((shared_ptr<mocker::ir::Ret> *)local_480);
                    if (p_1.
                        super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_ == 0) {
                      dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                                ((ir *)local_4b0,(shared_ptr<mocker::ir::IRInst> *)local_18);
                      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_4b0);
                      if (bVar2) {
                        if ((fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::
                             opName_abi_cxx11_ == '\0') &&
                           (iVar4 = __cxa_guard_acquire(&
                                                  fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                                  ::opName_abi_cxx11_), iVar4 != 0)) {
                          local_7e9 = 1;
                          local_658 = &local_650;
                          local_65c = BitOr;
                          s_abi_cxx11_(&local_680,"bitor",5);
                          std::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    (&local_650,&local_65c,&local_680);
                          local_684 = BitAnd;
                          local_658 = &local_628;
                          s_abi_cxx11_(&local_6a8,"bitand",6);
                          std::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    (&local_628,&local_684,&local_6a8);
                          local_6ac = Xor;
                          local_658 = &local_600;
                          s_abi_cxx11_(&local_6d0,"xor",3);
                          std::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    (&local_600,&local_6ac,&local_6d0);
                          local_6d4 = Shl;
                          local_658 = &local_5d8;
                          s_abi_cxx11_(&local_6f8,"shl",3);
                          std::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    (&local_5d8,&local_6d4,&local_6f8);
                          local_6fc = Shr;
                          local_658 = &local_5b0;
                          s_abi_cxx11_(&local_720,"shr",3);
                          std::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    (&local_5b0,&local_6fc,&local_720);
                          local_724 = Add;
                          local_658 = &local_588;
                          s_abi_cxx11_(&local_748,"add",3);
                          std::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    (&local_588,&local_724,&local_748);
                          local_74c = Sub;
                          local_658 = &local_560;
                          s_abi_cxx11_(&local_770,"sub",3);
                          std::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    (&local_560,&local_74c,&local_770);
                          local_774 = Mul;
                          local_658 = &local_538;
                          s_abi_cxx11_(&local_798,"mul",3);
                          std::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    (&local_538,&local_774,&local_798);
                          local_79c = Div;
                          local_658 = &local_510;
                          s_abi_cxx11_(&local_7c0,"div",3);
                          std::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    (&local_510,&local_79c,&local_7c0);
                          local_7c4 = Mod;
                          local_658 = &local_4e8;
                          s_abi_cxx11_(&local_7e8,"mod",3);
                          std::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    (&local_4e8,&local_7c4,&local_7e8);
                          local_7e9 = 0;
                          local_4c0._0_8_ = &local_650;
                          local_4c0._8_8_ = 10;
                          SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::SmallMap(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                      ::opName_abi_cxx11_,
                                     (initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_4c0);
                          local_fb0 = (pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_4c0;
                          do {
                            local_fb0 = local_fb0 + -1;
                            std::
                            pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~pair(local_fb0);
                          } while (local_fb0 != &local_650);
                          std::__cxx11::string::~string((string *)&local_7e8);
                          std::__cxx11::string::~string((string *)&local_7c0);
                          std::__cxx11::string::~string((string *)&local_798);
                          std::__cxx11::string::~string((string *)&local_770);
                          std::__cxx11::string::~string((string *)&local_748);
                          std::__cxx11::string::~string((string *)&local_720);
                          std::__cxx11::string::~string((string *)&local_6f8);
                          std::__cxx11::string::~string((string *)&local_6d0);
                          std::__cxx11::string::~string((string *)&local_6a8);
                          std::__cxx11::string::~string((string *)&local_680);
                          __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ::~SmallMap,
                                       &fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                        ::opName_abi_cxx11_,&__dso_handle);
                          __cxa_guard_release(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                               ::opName_abi_cxx11_);
                        }
                        peVar14 = std::
                                  __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)local_4b0);
                        psVar20 = Definition::getDest(&peVar14->super_Definition);
                        std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                                  (&local_8c0,psVar20);
                        fmtAddr_abi_cxx11_(&local_8b0,(ir *)&local_8c0,addr_16);
                        std::operator+(&local_890,&local_8b0," = ");
                        peVar14 = std::
                                  __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)local_4b0);
                        local_8c4 = ArithBinaryInst::getOp(peVar14);
                        pbVar21 = SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::at(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                        ::opName_abi_cxx11_,&local_8c4);
                        std::operator+(&local_870,&local_890,pbVar21);
                        std::operator+(&local_850,&local_870," ");
                        peVar14 = std::
                                  __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)local_4b0);
                        piVar22 = (ir *)ArithBinaryInst::getLhs(peVar14);
                        fmtAddr_abi_cxx11_(&local_8e8,piVar22,addr_17);
                        std::operator+(&local_830,&local_850,&local_8e8);
                        std::operator+(&local_810,&local_830," ");
                        peVar14 = std::
                                  __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)local_4b0);
                        piVar22 = (ir *)ArithBinaryInst::getRhs(peVar14);
                        fmtAddr_abi_cxx11_((string *)
                                           &p_10.
                                            super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,piVar22,addr_18);
                        std::operator+(__return_storage_ptr__,&local_810,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&p_10.
                                           super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
                        std::__cxx11::string::~string
                                  ((string *)
                                   &p_10.
                                    super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        std::__cxx11::string::~string((string *)&local_810);
                        std::__cxx11::string::~string((string *)&local_830);
                        std::__cxx11::string::~string((string *)&local_8e8);
                        std::__cxx11::string::~string((string *)&local_850);
                        std::__cxx11::string::~string((string *)&local_870);
                        std::__cxx11::string::~string((string *)&local_890);
                        std::__cxx11::string::~string((string *)&local_8b0);
                        std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_8c0);
                        p_1.
                        super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_ = 1;
                      }
                      else {
                        p_1.
                        super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_ = 0;
                      }
                      std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
                                ((shared_ptr<mocker::ir::ArithBinaryInst> *)local_4b0);
                      if (p_1.
                          super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_ == 0) {
                        dyc<mocker::ir::Comment,std::shared_ptr<mocker::ir::IRInst>const&>
                                  ((ir *)&p_11.
                                          super___shared_ptr<mocker::ir::AttachedComment,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,(shared_ptr<mocker::ir::IRInst> *)local_18);
                        bVar2 = std::__shared_ptr::operator_cast_to_bool
                                          ((__shared_ptr *)
                                           &p_11.
                                            super___shared_ptr<mocker::ir::AttachedComment,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                        if (bVar2) {
                          this_01 = std::
                                    __shared_ptr_access<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&p_11.
                                                  super___shared_ptr<mocker::ir::AttachedComment,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                          psVar17 = Comment::getContent_abi_cxx11_(this_01);
                          std::operator+(__return_storage_ptr__,"; ",psVar17);
                        }
                        p_1.
                        super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._5_3_ = 0;
                        p_1.
                        super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_1_ = bVar2;
                        std::shared_ptr<mocker::ir::Comment>::~shared_ptr
                                  ((shared_ptr<mocker::ir::Comment> *)
                                   &p_11.
                                    super___shared_ptr<mocker::ir::AttachedComment,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        if (p_1.
                            super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_ == 0) {
                          dyc<mocker::ir::AttachedComment,std::shared_ptr<mocker::ir::IRInst>const&>
                                    ((ir *)&p_12.
                                            super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,(shared_ptr<mocker::ir::IRInst> *)local_18)
                          ;
                          bVar2 = std::__shared_ptr::operator_cast_to_bool
                                            ((__shared_ptr *)
                                             &p_12.
                                              super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
                          if (bVar2) {
                            this_02 = std::
                                      __shared_ptr_access<mocker::ir::AttachedComment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      ::operator->((
                                                  __shared_ptr_access<mocker::ir::AttachedComment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&p_12.
                                                  super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                            psVar17 = AttachedComment::getContent_abi_cxx11_(this_02);
                            std::operator+(__return_storage_ptr__,"; ",psVar17);
                          }
                          p_1.
                          super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._5_3_ = 0;
                          p_1.
                          super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_1_ = bVar2;
                          std::shared_ptr<mocker::ir::AttachedComment>::~shared_ptr
                                    ((shared_ptr<mocker::ir::AttachedComment> *)
                                     &p_12.
                                      super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                          if (p_1.
                              super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi._4_4_ == 0) {
                            dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                                      ((ir *)local_938,(shared_ptr<mocker::ir::IRInst> *)local_18);
                            bVar2 = std::__shared_ptr::operator_cast_to_bool
                                              ((__shared_ptr *)local_938);
                            if (bVar2) {
                              local_939 = 0;
                              std::__cxx11::string::string((string *)__return_storage_ptr__);
                              peVar15 = std::
                                        __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        ::operator->((
                                                  __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_938);
                              p_Var16 = (__shared_ptr *)
                                        Definition::getDest(&peVar15->super_Definition);
                              bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var16);
                              if (bVar2) {
                                peVar15 = std::
                                          __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          ::operator->((
                                                  __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_938);
                                psVar20 = Definition::getDest(&peVar15->super_Definition);
                                std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                                          (&local_990,psVar20);
                                fmtAddr_abi_cxx11_(&local_980,(ir *)&local_990,addr_19);
                                std::operator+(&local_960,&local_980," = ");
                                std::__cxx11::string::operator=
                                          ((string *)__return_storage_ptr__,(string *)&local_960);
                                std::__cxx11::string::~string((string *)&local_960);
                                std::__cxx11::string::~string((string *)&local_980);
                                std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_990);
                              }
                              peVar15 = std::
                                        __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        ::operator->((
                                                  __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_938);
                              psVar17 = Call::getFuncName_abi_cxx11_(peVar15);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&__range3,"call ",psVar17);
                              std::__cxx11::string::operator+=
                                        ((string *)__return_storage_ptr__,(string *)&__range3);
                              std::__cxx11::string::~string((string *)&__range3);
                              peVar15 = std::
                                        __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        ::operator->((
                                                  __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_938);
                              this_03 = Call::getArgs(peVar15);
                              __end3 = std::
                                       vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                       ::begin(this_03);
                              addr = (shared_ptr<mocker::ir::Addr> *)
                                     std::
                                     vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                     ::end(this_03);
                              while (bVar2 = __gnu_cxx::operator!=
                                                       (&__end3,(
                                                  __normal_iterator<const_std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                                                  *)&addr), bVar2) {
                                local_9d0 = (ir *)__gnu_cxx::
                                                  __normal_iterator<const_std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                                                  ::operator*(&__end3);
                                fmtAddr_abi_cxx11_((string *)
                                                   &p_13.
                                                  super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,local_9d0,addr_20);
                                std::operator+(&local_9f0," ",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&p_13.
                                                  super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                std::__cxx11::string::operator+=
                                          ((string *)__return_storage_ptr__,(string *)&local_9f0);
                                std::__cxx11::string::~string((string *)&local_9f0);
                                std::__cxx11::string::~string
                                          ((string *)
                                           &p_13.
                                            super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                                __gnu_cxx::
                                __normal_iterator<const_std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                                ::operator++(&__end3);
                              }
                              p_1.
                              super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi._4_4_ = 1;
                              local_939 = 1;
                            }
                            else {
                              p_1.
                              super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi._4_4_ = 0;
                            }
                            std::shared_ptr<mocker::ir::Call>::~shared_ptr
                                      ((shared_ptr<mocker::ir::Call> *)local_938);
                            if (p_1.
                                super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi._4_4_ == 0) {
                              dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                                        ((ir *)local_a20,(shared_ptr<mocker::ir::IRInst> *)local_18)
                              ;
                              bVar2 = std::__shared_ptr::operator_cast_to_bool
                                                ((__shared_ptr *)local_a20);
                              if (bVar2) {
                                local_a21 = 0;
                                peVar18 = std::
                                          __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          ::operator->((
                                                  __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_a20);
                                psVar20 = Definition::getDest(&peVar18->super_Definition);
                                std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                                          ((shared_ptr<mocker::ir::Addr> *)&__range3_1,psVar20);
                                fmtAddr_abi_cxx11_(&local_a48,(ir *)&__range3_1,addr_21);
                                std::operator+(__return_storage_ptr__,&local_a48," = phi ");
                                std::__cxx11::string::~string((string *)&local_a48);
                                std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                                          ((shared_ptr<mocker::ir::Addr> *)&__range3_1);
                                peVar18 = std::
                                          __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          ::operator->((
                                                  __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_a20);
                                this_04 = Phi::getOptions(peVar18);
                                __end3_1 = std::
                                           vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                           ::begin(this_04);
                                kv = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                                      *)std::
                                        vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                        ::end(this_04);
                                while (bVar2 = __gnu_cxx::operator!=
                                                         (&__end3_1,
                                                          (
                                                  __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                                                  *)&kv), bVar2) {
                                  local_a78 = __gnu_cxx::
                                              __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                                              ::operator*(&__end3_1);
                                  fmtAddr_abi_cxx11_(&local_b18,(ir *)local_a78,addr_22);
                                  std::operator+(&local_af8,"[ ",&local_b18);
                                  std::operator+(&local_ad8,&local_af8," ");
                                  p_Var1 = &p_14.
                                            super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount;
                                  std::shared_ptr<mocker::ir::Addr>::
                                  shared_ptr<mocker::ir::Label,void>
                                            ((shared_ptr<mocker::ir::Addr> *)p_Var1,
                                             &local_a78->second);
                                  fmtAddr_abi_cxx11_(&local_b38,(ir *)p_Var1,addr_23);
                                  std::operator+(&local_ab8,&local_ad8,&local_b38);
                                  std::operator+(&local_a98,&local_ab8," ] ");
                                  std::__cxx11::string::operator+=
                                            ((string *)__return_storage_ptr__,(string *)&local_a98);
                                  std::__cxx11::string::~string((string *)&local_a98);
                                  std::__cxx11::string::~string((string *)&local_ab8);
                                  std::__cxx11::string::~string((string *)&local_b38);
                                  std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                                            ((shared_ptr<mocker::ir::Addr> *)
                                             &p_14.
                                              super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
                                  std::__cxx11::string::~string((string *)&local_ad8);
                                  std::__cxx11::string::~string((string *)&local_af8);
                                  std::__cxx11::string::~string((string *)&local_b18);
                                  __gnu_cxx::
                                  __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                                  ::operator++(&__end3_1);
                                }
                                p_1.
                                super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi._4_4_ = 1;
                                local_a21 = 1;
                              }
                              else {
                                p_1.
                                super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi._4_4_ = 0;
                              }
                              std::shared_ptr<mocker::ir::Phi>::~shared_ptr
                                        ((shared_ptr<mocker::ir::Phi> *)local_a20);
                              if (p_1.
                                  super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_ == 0) {
                                dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>const&>
                                          ((ir *)local_b58,
                                           (shared_ptr<mocker::ir::IRInst> *)local_18);
                                bVar2 = std::__shared_ptr::operator_cast_to_bool
                                                  ((__shared_ptr *)local_b58);
                                if (bVar2) {
                                  if ((fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                       ::opName_abi_cxx11_ == '\0') &&
                                     (iVar4 = __cxa_guard_acquire(&
                                                  fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                                  ::opName_abi_cxx11_), iVar4 != 0)) {
                                    local_d51 = 1;
                                    local_c60 = &local_c58;
                                    local_c64 = Ne;
                                    s_abi_cxx11_(&local_c88,"ne",2);
                                    std::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                              (&local_c58,&local_c64,&local_c88);
                                    local_c8c = Eq;
                                    local_c60 = &local_c30;
                                    s_abi_cxx11_(&local_cb0,"eq",2);
                                    std::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                              (&local_c30,&local_c8c,&local_cb0);
                                    local_cb4 = Lt;
                                    local_c60 = &local_c08;
                                    s_abi_cxx11_(&local_cd8,"lt",2);
                                    std::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                              (&local_c08,&local_cb4,&local_cd8);
                                    local_cdc = Le;
                                    local_c60 = &local_be0;
                                    s_abi_cxx11_(&local_d00,"le",2);
                                    std::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                              (&local_be0,&local_cdc,&local_d00);
                                    local_d04 = Gt;
                                    local_c60 = &local_bb8;
                                    s_abi_cxx11_(&local_d28,"gt",2);
                                    std::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                              (&local_bb8,&local_d04,&local_d28);
                                    local_d2c = Ge;
                                    local_c60 = &local_b90;
                                    s_abi_cxx11_(&local_d50,"ge",2);
                                    std::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::
                                    pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                              (&local_b90,&local_d2c,&local_d50);
                                    local_d51 = 0;
                                    local_b68._0_8_ = &local_c58;
                                    local_b68._8_8_ = 6;
                                    SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::SmallMap(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                                ::opName_abi_cxx11_,
                                               (initializer_list<std::pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_b68);
                                    local_10a0 = (pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_b68;
                                    do {
                                      local_10a0 = local_10a0 + -1;
                                      std::
                                      pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~pair(local_10a0);
                                    } while (local_10a0 != &local_c58);
                                    std::__cxx11::string::~string((string *)&local_d50);
                                    std::__cxx11::string::~string((string *)&local_d28);
                                    std::__cxx11::string::~string((string *)&local_d00);
                                    std::__cxx11::string::~string((string *)&local_cd8);
                                    std::__cxx11::string::~string((string *)&local_cb0);
                                    std::__cxx11::string::~string((string *)&local_c88);
                                    __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 ::~SmallMap,
                                                 &fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                                  ::opName_abi_cxx11_,&__dso_handle);
                                    __cxa_guard_release(&
                                                  fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                                  ::opName_abi_cxx11_);
                                  }
                                  peVar19 = std::
                                            __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            ::operator->((
                                                  __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_b58);
                                  psVar20 = Definition::getDest(&peVar19->super_Definition);
                                  std::shared_ptr<mocker::ir::Addr>::
                                  shared_ptr<mocker::ir::Reg,void>(&local_e28,psVar20);
                                  fmtAddr_abi_cxx11_(&local_e18,(ir *)&local_e28,addr_24);
                                  std::operator+(&local_df8,&local_e18," = ");
                                  peVar19 = std::
                                            __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            ::operator->((
                                                  __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_b58);
                                  local_e2c = RelationInst::getOp(peVar19);
                                  pbVar21 = SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::at(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                                  ::opName_abi_cxx11_,&local_e2c);
                                  std::operator+(&local_dd8,&local_df8,pbVar21);
                                  std::operator+(&local_db8,&local_dd8," ");
                                  peVar19 = std::
                                            __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            ::operator->((
                                                  __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_b58);
                                  piVar22 = (ir *)RelationInst::getLhs(peVar19);
                                  fmtAddr_abi_cxx11_(&local_e50,piVar22,addr_25);
                                  std::operator+(&local_d98,&local_db8,&local_e50);
                                  std::operator+(&local_d78,&local_d98," ");
                                  peVar19 = std::
                                            __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            ::operator->((
                                                  __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_b58);
                                  piVar22 = (ir *)RelationInst::getRhs(peVar19);
                                  fmtAddr_abi_cxx11_(&local_e70,piVar22,addr_26);
                                  std::operator+(__return_storage_ptr__,&local_d78,&local_e70);
                                  std::__cxx11::string::~string((string *)&local_e70);
                                  std::__cxx11::string::~string((string *)&local_d78);
                                  std::__cxx11::string::~string((string *)&local_d98);
                                  std::__cxx11::string::~string((string *)&local_e50);
                                  std::__cxx11::string::~string((string *)&local_db8);
                                  std::__cxx11::string::~string((string *)&local_dd8);
                                  std::__cxx11::string::~string((string *)&local_df8);
                                  std::__cxx11::string::~string((string *)&local_e18);
                                  std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_e28);
                                  p_1.
                                  super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_ = 1;
                                }
                                else {
                                  p_1.
                                  super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_ = 0;
                                }
                                std::shared_ptr<mocker::ir::RelationInst>::~shared_ptr
                                          ((shared_ptr<mocker::ir::RelationInst> *)local_b58);
                                if (p_1.
                                    super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi._4_4_ == 0) {
                                  __assert_fail("false",
                                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/printer.cpp"
                                                ,0x6a,
                                                "std::string mocker::ir::fmtInst(const std::shared_ptr<IRInst> &)"
                                               );
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fmtInst(const std::shared_ptr<IRInst> &inst) {
  using namespace std::string_literals;

  if (dyc<Deleted>(inst)) {
    return "";
  }
  if (auto p = dyc<Assign>(inst)) {
    return fmtAddr(p->getDest()) + " = assign " + fmtAddr(p->getOperand());
  }
  if (auto p = dyc<ArithUnaryInst>(inst)) {
    auto res = fmtAddr(p->getDest()) + " = ";
    res += (p->getOp() == ArithUnaryInst::Neg ? "neg" : "bitnot");
    res += " " + fmtAddr(p->getOperand());
    return res;
  }
  if (auto p = dyc<Alloca>(inst)) {
    return fmtAddr(p->getDest()) + " = alloca";
  }
  if (auto p = dyc<Malloc>(inst)) {
    return fmtAddr(p->getDest()) + " = malloc " + fmtAddr(p->getSize());
  }
  if (auto p = dyc<Store>(inst)) {
    return "store " + fmtAddr(p->getAddr()) + " " + fmtAddr(p->getVal());
  }
  if (auto p = dyc<Load>(inst)) {
    return fmtAddr(p->getDest()) + " = load " + fmtAddr(p->getAddr());
  }
  if (auto p = dyc<Branch>(inst)) {
    return "br " + fmtAddr(p->getCondition()) + " " + fmtAddr(p->getThen()) +
           " " + fmtAddr(p->getElse());
  }
  if (auto p = dyc<Jump>(inst)) {
    return "jump " + fmtAddr(p->getLabel());
  }
  if (auto p = dyc<Ret>(inst)) {
    return "ret " + (p->getVal() ? fmtAddr(p->getVal()) : "void"s);
  }
  if (auto p = dyc<ArithBinaryInst>(inst)) {
    static SmallMap<ArithBinaryInst::OpType, std::string> opName{
        {ArithBinaryInst::BitOr, "bitor"s},
        {ArithBinaryInst::BitAnd, "bitand"s},
        {ArithBinaryInst::Xor, "xor"s},
        {ArithBinaryInst::Shl, "shl"s},
        {ArithBinaryInst::Shr, "shr"s},
        {ArithBinaryInst::Add, "add"s},
        {ArithBinaryInst::Sub, "sub"s},
        {ArithBinaryInst::Mul, "mul"s},
        {ArithBinaryInst::Div, "div"s},
        {ArithBinaryInst::Mod, "mod"s},
    };
    return fmtAddr(p->getDest()) + " = " + opName.at(p->getOp()) + " " +
           fmtAddr(p->getLhs()) + " " + fmtAddr(p->getRhs());
  }
  if (auto p = dyc<Comment>(inst)) {
    return "; " + p->getContent();
  }
  if (auto p = dyc<AttachedComment>(inst)) {
    return "; " + p->getContent();
  }
  if (auto p = dyc<Call>(inst)) {
    std::string res;
    if (p->getDest())
      res = fmtAddr(p->getDest()) + " = ";
    res += "call " + p->getFuncName();
    for (auto &addr : p->getArgs())
      res += " " + fmtAddr(addr);
    return res;
  }
  if (auto p = dyc<Phi>(inst)) {
    std::string res = fmtAddr(p->getDest()) + " = phi ";
    for (auto &kv : p->getOptions())
      res += "[ " + fmtAddr(kv.first) + " " + fmtAddr(kv.second) + " ] ";
    return res;
  }
  if (auto p = dyc<RelationInst>(inst)) {
    static SmallMap<RelationInst::OpType, std::string> opName{
        {RelationInst::OpType::Ne, "ne"s}, {RelationInst::OpType::Eq, "eq"s},
        {RelationInst::OpType::Lt, "lt"s}, {RelationInst::OpType::Le, "le"s},
        {RelationInst::OpType::Gt, "gt"s}, {RelationInst::OpType::Ge, "ge"s}};
    return fmtAddr(p->getDest()) + " = " + opName.at(p->getOp()) + " " +
           fmtAddr(p->getLhs()) + " " + fmtAddr(p->getRhs());
  }
  assert(false);
}